

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

void __thiscall amrex::MLNodeLinOp::buildMasks(MLNodeLinOp *this)

{
  int *piVar1;
  pointer paVar2;
  pointer paVar3;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> cmf;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>,_true,_true>
  _Var4;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> fmf;
  iMultiFab *piVar5;
  Geometry *geom;
  GpuArray<amrex::LinOpBCType,_3U> bchi;
  long lVar6;
  long lVar7;
  int i;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  pointer paVar11;
  pointer paVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  pointer pVVar16;
  int j;
  int iVar17;
  long lVar18;
  pointer puVar19;
  long lVar20;
  pointer piVar21;
  long lVar22;
  int j_2;
  int iVar23;
  byte bVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int k_1;
  int k_3;
  int iVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  Periodicity PVar36;
  GpuArray<amrex::LinOpBCType,_3U> bclo;
  Array4<int> local_3d8;
  MLNodeLinOp *local_398;
  LinOpBCType local_38c;
  long local_388;
  undefined **local_380;
  long local_378;
  FabArrayBase *local_370;
  tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> local_368;
  long local_360;
  FabArray<amrex::IArrayBox> *local_358;
  long local_350;
  ulong local_348;
  long local_340;
  GpuArray<amrex::LinOpBCType,_3U> local_338;
  LinOpBCType local_32c;
  Box bx;
  GpuArray<amrex::LinOpBCType,_3U> local_2d8;
  MFIter mfi;
  MFItInfo local_264;
  Array4<const_int> local_250;
  ulong local_210;
  long local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  long local_1e0;
  Periodicity local_1d8;
  Box local_1cc;
  iMultiFab ccm;
  
  if (this->m_masks_built == false) {
    this->m_is_bottom_singular = false;
    this->m_masks_built = true;
    paVar2 = (this->super_MLLinOp).m_lobc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)
         CONCAT44(ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_,
                  0x65);
    paVar11 = (pointer)std::
                       __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                                 (paVar2,paVar2 + 1,&ccm);
    paVar2 = (this->super_MLLinOp).m_hibc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)
         CONCAT44(ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_,
                  0x65);
    paVar12 = (pointer)std::
                       __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                                 (paVar2,paVar2 + 1,&ccm);
    paVar2 = (this->super_MLLinOp).m_lobc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar3 = (this->super_MLLinOp).m_hibc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((paVar11 == paVar2 + 1) && (paVar12 == paVar3 + 1)) {
      bVar24 = this->m_overset_dirichlet_mask ^ 1;
      if (*(this->super_MLLinOp).m_domain_covered.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
          0) {
        bVar24 = false;
      }
      this->m_is_bottom_singular = (bool)bVar24;
    }
    local_2d8.arr._0_8_ = *(undefined8 *)paVar2->_M_elems;
    local_38c = paVar2->_M_elems[2];
    local_338.arr._0_8_ = *(undefined8 *)paVar3->_M_elems;
    local_338.arr[2] = paVar3->_M_elems[2];
    local_1f0 = local_2d8.arr._0_8_ & 0xffffffff;
    local_1f8 = local_338.arr._0_8_ & 0xffffffff;
    local_200 = local_2d8.arr._0_8_ & 0xffffffff00000000;
    local_1e8 = local_338.arr._0_8_ & 0xffffffff00000000;
    lVar15 = 0;
    local_398 = this;
    local_32c = local_338.arr[2];
    local_2d8.arr[2] = local_38c;
    local_210 = local_2d8.arr._0_8_;
    while (uVar13 = (ulong)(this->super_MLLinOp).m_num_amr_levels, lVar15 < (long)uVar13) {
      local_360 = lVar15 * 0x18;
      local_208 = lVar15;
      for (lVar14 = 0;
          lVar14 < (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_208]; lVar14 = lVar14 + 1) {
        lVar15 = *(long *)((long)&(((this->super_MLLinOp).m_geom.
                                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                    .
                                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                          + local_360);
        local_350 = lVar14;
        local_1d8 = Geometry::periodicity((Geometry *)(lVar15 + lVar14 * 200));
        lVar15 = lVar15 + lVar14 * 200;
        bx.smallend.vect._0_8_ = *(undefined8 *)(((Box *)(lVar15 + 0xac))->smallend).vect;
        bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(lVar15 + 0xb8) >> 0x20);
        bx._20_8_ = *(undefined8 *)(lVar15 + 0xc0);
        bx.smallend.vect[2] = (int)*(undefined8 *)(lVar15 + 0xb4);
        bx.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar15 + 0xb4) >> 0x20);
        for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
          if ((bx.btype.itype >> ((uint)lVar14 & 0x1f) & 1) == 0) {
            piVar1 = bx.bigend.vect + lVar14;
            *piVar1 = *piVar1 + 1;
          }
        }
        bx.btype.itype = 7;
        local_358 = *(FabArray<amrex::IArrayBox> **)
                     (*(long *)((long)&(((local_398->m_dirichlet_mask).
                                         super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                         .
                                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                       ).
                                       super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                               + local_360) + local_350 * 8);
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
        mfi.tile_size.vect[2] = 0;
        mfi.flags = '\0';
        mfi._29_3_ = 0;
        mfi.currentIndex = 0;
        mfi.beginIndex = 0;
        mfi.fabArray = (FabArrayBase *)0x0;
        mfi.tile_size.vect[0] = 0;
        mfi.tile_size.vect[1] = 0;
        local_3d8.p = (int *)&PTR__FabFactory_007d3518;
        uVar34 = 1;
        iMultiFab::iMultiFab
                  ((iMultiFab *)&ccm.super_FabArray<amrex::IArrayBox>,
                   (BoxArray *)
                   (local_350 * 0x68 +
                   *(long *)((long)&(((local_398->super_MLLinOp).m_grids.
                                      super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)
                                    .
                                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                            + local_360)),
                   (DistributionMapping *)
                   (local_350 * 0x10 +
                   *(long *)((long)&(((local_398->super_MLLinOp).m_dmap.
                                      super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                    ).
                                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            + local_360)),1,1,(MFInfo *)&mfi,
                   (FabFactory<amrex::IArrayBox> *)&local_3d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mfi.tile_size);
        FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
                  (&ccm.super_FabArray<amrex::IArrayBox>,(Box *)(lVar15 + 0xac),&local_1d8,0,1,2,0);
        lVar14 = local_350;
        this = local_398;
        local_264.do_tiling = false;
        local_264.dynamic = true;
        local_264.device_sync = true;
        local_264.num_streams = Gpu::Device::max_gpu_streams;
        local_264.tilesize.vect[0] = 0;
        local_264.tilesize.vect[1] = 0;
        local_264.tilesize.vect[2] = 0;
        if ((local_350 != 0) && (local_398->m_overset_dirichlet_mask != false)) {
          mfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                )&DAT_200000002;
          mfi.fabArray = (FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,2);
          average_down_nodal<amrex::IArrayBox>
                    (*(FabArray<amrex::IArrayBox> **)
                      (*(long *)((long)&(((local_398->m_dirichlet_mask).
                                          super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                        ).
                                        super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                + local_360) + -8 + local_350 * 8),local_358,(IntVect *)&mfi,0,false
                    );
        }
        MFIter::MFIter(&mfi,&local_358->super_FabArrayBase,&local_264);
        iVar25 = bx.bigend.vect[1];
        iVar9 = bx.bigend.vect[0];
        iVar23 = bx.smallend.vect[2];
        iVar29 = bx.smallend.vect[1];
        lVar18 = (long)bx.smallend.vect[1];
        lVar20 = (long)bx.smallend.vect[2];
        lVar15 = (long)bx.bigend.vect[0];
        lVar26 = (long)bx.bigend.vect[1];
        local_1e0 = (long)bx.bigend.vect[2];
        local_388 = (long)bx.smallend.vect[0];
        while (mfi.currentIndex < mfi.endIndex) {
          MFIter::validbox(&local_1cc,&mfi);
          FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>(&local_3d8,local_358,&mfi);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    (&local_250,&ccm.super_FabArray<amrex::IArrayBox>,&mfi);
          lVar14 = local_350;
          iVar33 = local_1cc.bigend.vect[0] + 1;
          for (iVar31 = local_1cc.smallend.vect[2]; iVar31 <= local_1cc.bigend.vect[2];
              iVar31 = iVar31 + 1) {
            local_380 = (undefined **)local_3d8.p;
            local_340 = CONCAT44(local_3d8.jstride._4_4_,(int)local_3d8.jstride);
            local_348 = local_3d8.kstride;
            for (iVar17 = local_1cc.smallend.vect[1]; iVar17 <= local_1cc.bigend.vect[1];
                iVar17 = iVar17 + 1) {
              if (local_1cc.smallend.vect[0] <= local_1cc.bigend.vect[0]) {
                local_368.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                     (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      )CONCAT44(local_250.p._4_4_,(int)local_250.p);
                local_370 = (FabArrayBase *)CONCAT44(local_250.jstride._4_4_,(int)local_250.jstride)
                ;
                local_378 = CONCAT44(local_250.kstride._4_4_,(int)local_250.kstride);
                iVar8 = local_1cc.smallend.vect[0];
                do {
                  lVar32 = ((long)iVar31 - (long)local_3d8.begin.z) * local_3d8.kstride;
                  lVar28 = (long)(iVar8 - local_3d8.begin.x) * 4 +
                           ((long)iVar17 - (long)local_3d8.begin.y) * local_340 * 4;
                  if (*(int *)((long)local_3d8.p + lVar32 * 4 + lVar28) == 0) {
                    lVar27 = (long)(~local_250.begin.y + iVar17) * (long)local_370;
                    lVar22 = (~local_250.begin.z + iVar31) * local_378;
                    lVar6 = (long)(~local_250.begin.x + iVar8) * 4 + lVar27 * 4;
                    uVar35 = 1;
                    if (*(int *)((long)&((FabArrayBase *)
                                        local_368.
                                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                        _M_head_impl)->_vptr_FabArrayBase + lVar22 * 4 + lVar6) != 1
                       ) {
                      lVar27 = (long)(iVar8 - local_250.begin.x) * 4 + lVar27 * 4;
                      if (*(int *)((long)&((FabArrayBase *)
                                          local_368.
                                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                          _M_head_impl)->_vptr_FabArrayBase + lVar22 * 4 + lVar27)
                          != 1) {
                        lVar30 = (long)(iVar17 - local_250.begin.y) * (long)local_370;
                        lVar7 = (long)(~local_250.begin.x + iVar8) * 4 + lVar30 * 4;
                        uVar35 = uVar34;
                        if ((((*(int *)((long)&((FabArrayBase *)
                                               local_368.
                                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                               _M_head_impl)->_vptr_FabArrayBase +
                                       lVar22 * 4 + lVar7) != 1) &&
                             (lVar30 = (long)(iVar8 - local_250.begin.x) * 4 + lVar30 * 4,
                             *(int *)((long)&((FabArrayBase *)
                                             local_368.
                                             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                             _M_head_impl)->_vptr_FabArrayBase + lVar22 * 4 + lVar30
                                     ) != 1)) &&
                            (lVar22 = (iVar31 - local_250.begin.z) * local_378,
                            *(int *)((long)&((FabArrayBase *)
                                            local_368.
                                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                            _M_head_impl)->_vptr_FabArrayBase + lVar22 * 4 + lVar6)
                            != 1)) &&
                           ((*(int *)((long)&((FabArrayBase *)
                                             local_368.
                                             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                             _M_head_impl)->_vptr_FabArrayBase + lVar22 * 4 + lVar27
                                     ) != 1 &&
                            (*(int *)((long)&((FabArrayBase *)
                                             local_368.
                                             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                             _M_head_impl)->_vptr_FabArrayBase + lVar22 * 4 + lVar7)
                             != 1)))) {
                          uVar35 = (uint)(*(int *)((long)&((FabArrayBase *)
                                                          local_368.
                                                                                                                    
                                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                  .
                                                  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                  ._M_head_impl)->_vptr_FabArrayBase +
                                                  lVar22 * 4 + lVar30) == 1);
                        }
                      }
                    }
                    *(uint *)((long)local_3d8.p + lVar32 * 4 + lVar28) = uVar35;
                  }
                  iVar8 = iVar8 + 1;
                } while (iVar33 != iVar8);
              }
              this = local_398;
            }
          }
          iVar31 = local_1cc.smallend.vect[2];
          if (local_1cc.smallend.vect[0] == (int)local_388 && (int)local_1f0 == 0x65) {
            for (; iVar31 <= local_1cc.bigend.vect[2]; iVar31 = iVar31 + 1) {
              for (lVar28 = (long)local_1cc.smallend.vect[1];
                  (int)lVar28 <= local_1cc.bigend.vect[1]; lVar28 = lVar28 + 1) {
                *(undefined4 *)
                 ((long)local_3d8.p +
                 ((long)iVar31 - (long)local_3d8.begin.z) * local_3d8.kstride * 4 +
                 (local_388 - local_3d8.begin.x) * 4 +
                 (lVar28 - local_3d8.begin.y) *
                 CONCAT44(local_3d8.jstride._4_4_,(int)local_3d8.jstride) * 4) = 1;
              }
            }
          }
          if (((int)local_1f8 == 0x65) &&
             (iVar31 = local_1cc.smallend.vect[2], local_1cc.bigend.vect[0] == iVar9)) {
            for (; iVar31 <= local_1cc.bigend.vect[2]; iVar31 = iVar31 + 1) {
              for (lVar28 = (long)local_1cc.smallend.vect[1];
                  (int)lVar28 <= local_1cc.bigend.vect[1]; lVar28 = lVar28 + 1) {
                *(undefined4 *)
                 ((long)local_3d8.p +
                 ((long)iVar31 - (long)local_3d8.begin.z) * local_3d8.kstride * 4 +
                 (lVar15 - local_3d8.begin.x) * 4 +
                 (lVar28 - local_3d8.begin.y) *
                 CONCAT44(local_3d8.jstride._4_4_,(int)local_3d8.jstride) * 4) = 1;
              }
            }
          }
          if ((local_200 == 0x6500000000) && (local_1cc.smallend.vect[1] == iVar29)) {
            for (iVar31 = local_1cc.smallend.vect[2]; iVar31 <= local_1cc.bigend.vect[2];
                iVar31 = iVar31 + 1) {
              iVar17 = local_1cc.smallend.vect[0];
              if (local_1cc.smallend.vect[0] <= local_1cc.bigend.vect[0]) {
                do {
                  *(undefined4 *)
                   ((long)local_3d8.p +
                   ((long)iVar31 - (long)local_3d8.begin.z) * local_3d8.kstride * 4 +
                   (long)(iVar17 - local_3d8.begin.x) * 4 +
                   (lVar18 - local_3d8.begin.y) *
                   CONCAT44(local_3d8.jstride._4_4_,(int)local_3d8.jstride) * 4) = 1;
                  iVar17 = iVar17 + 1;
                } while (iVar33 != iVar17);
              }
            }
          }
          if ((local_1e8 == 0x6500000000) && (local_1cc.bigend.vect[1] == iVar25)) {
            for (iVar31 = local_1cc.smallend.vect[2]; iVar31 <= local_1cc.bigend.vect[2];
                iVar31 = iVar31 + 1) {
              iVar17 = local_1cc.smallend.vect[0];
              if (local_1cc.smallend.vect[0] <= local_1cc.bigend.vect[0]) {
                do {
                  *(undefined4 *)
                   ((long)local_3d8.p +
                   ((long)iVar31 - (long)local_3d8.begin.z) * local_3d8.kstride * 4 +
                   (long)(iVar17 - local_3d8.begin.x) * 4 +
                   (lVar26 - local_3d8.begin.y) *
                   CONCAT44(local_3d8.jstride._4_4_,(int)local_3d8.jstride) * 4) = 1;
                  iVar17 = iVar17 + 1;
                } while (iVar33 != iVar17);
              }
            }
          }
          if ((local_38c == Dirichlet) && (local_1cc.smallend.vect[2] == iVar23)) {
            for (iVar31 = local_1cc.smallend.vect[1]; iVar31 <= local_1cc.bigend.vect[1];
                iVar31 = iVar31 + 1) {
              iVar17 = local_1cc.smallend.vect[0];
              if (local_1cc.smallend.vect[0] <= local_1cc.bigend.vect[0]) {
                do {
                  *(undefined4 *)
                   ((long)local_3d8.p +
                   (lVar20 - local_3d8.begin.z) * local_3d8.kstride * 4 +
                   (long)(iVar17 - local_3d8.begin.x) * 4 +
                   ((long)iVar31 - (long)local_3d8.begin.y) *
                   CONCAT44(local_3d8.jstride._4_4_,(int)local_3d8.jstride) * 4) = 1;
                  iVar17 = iVar17 + 1;
                } while (iVar33 != iVar17);
              }
            }
          }
          if ((local_32c == Dirichlet) && (local_1cc.bigend.vect[2] == (int)local_1e0)) {
            for (iVar31 = local_1cc.smallend.vect[1]; iVar31 <= local_1cc.bigend.vect[1];
                iVar31 = iVar31 + 1) {
              iVar17 = local_1cc.smallend.vect[0];
              if (local_1cc.smallend.vect[0] <= local_1cc.bigend.vect[0]) {
                do {
                  *(undefined4 *)
                   ((long)local_3d8.p +
                   (local_1e0 - local_3d8.begin.z) * local_3d8.kstride * 4 +
                   (long)(iVar17 - local_3d8.begin.x) * 4 +
                   ((long)iVar31 - (long)local_3d8.begin.y) *
                   CONCAT44(local_3d8.jstride._4_4_,(int)local_3d8.jstride) * 4) = 1;
                  iVar17 = iVar17 + 1;
                } while (iVar33 != iVar17);
              }
            }
          }
          MFIter::operator++(&mfi);
        }
        MFIter::~MFIter(&mfi);
        iMultiFab::~iMultiFab(&ccm);
      }
      lVar15 = local_208 + 1;
    }
    lVar15 = 0;
    while (lVar14 = (long)((int)uVar13 + -1), lVar15 < lVar14) {
      puVar19 = (this->m_cc_fine_mask).
                super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      cmf.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           puVar19[lVar15]._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
      this_00.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           (this->m_nd_fine_mask).
           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
      _Var4.
      super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>.
      _M_t.
      super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
      .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
           (this->m_has_fine_bndry).
           super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
           super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
      ;
      piVar21 = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pVVar16 = (this->super_MLLinOp).m_geom.
                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = *(long *)&pVVar16[lVar15].
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      if ((piVar21[lVar15] != 2) && (piVar21[lVar15] != 4)) {
        Assert_host("AMRRefRatio(amrlev) == 2 || AMRRefRatio(amrlev) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
                    ,0x149,"\"ref_ratio != 2 and 4 not supported\"");
        puVar19 = (local_398->m_cc_fine_mask).
                  super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        piVar21 = (local_398->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>
                  .super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        pVVar16 = (local_398->super_MLLinOp).m_geom.
                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      local_388 = lVar15 + 1;
      fmf.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           puVar19[lVar15 + 1]._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           *(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
             *)((IntVect *)
               ((long)cmf.
                      super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                      .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 0xc0))->vect;
      mfi.fabArray = (FabArrayBase *)
                     CONCAT44(mfi.fabArray._4_4_,
                              *(int *)((long)cmf.
                                             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                             .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                             _M_head_impl + 200));
      local_3d8.jstride._0_4_ = piVar21[lVar15];
      local_3d8.p = (int *)CONCAT44((int)local_3d8.jstride,(int)local_3d8.jstride);
      PVar36 = Geometry::periodicity
                         (*(Geometry **)
                           &pVVar16[lVar15].
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
      local_250.p._0_4_ = PVar36.period.vect[0];
      local_250.p._4_4_ = PVar36.period.vect[1];
      local_250.jstride._0_4_ = PVar36.period.vect[2];
      makeFineMask<amrex::IArrayBox>
                ((iMultiFab *)&ccm.super_FabArray<amrex::IArrayBox>,
                 (FabArray<amrex::IArrayBox> *)
                 cmf.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                 (FabArray<amrex::IArrayBox> *)
                 fmf.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,(IntVect *)&mfi,
                 (IntVect *)&local_3d8,(Periodicity *)&local_250,0,1,
                 (LayoutData<int> *)
                 _Var4.
                 super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                 .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl);
      FabArray<amrex::IArrayBox>::operator=
                ((FabArray<amrex::IArrayBox> *)
                 cmf.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                 &ccm.super_FabArray<amrex::IArrayBox>);
      iMultiFab::~iMultiFab((iMultiFab *)&ccm.super_FabArray<amrex::IArrayBox>);
      MFIter::MFIter((MFIter *)&ccm.super_FabArray<amrex::IArrayBox>,
                     (FabArrayBase *)
                     cmf.
                     super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                     .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,'\0');
      while (ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
             m_loshft.vect[0] <
             ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
             m_loshft.vect[2]) {
        MFIter::validbox((Box *)&local_3d8,(MFIter *)&ccm);
        FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                  ((Array4<int> *)&mfi,
                   (FabArray<amrex::IArrayBox> *)
                   cmf.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,(MFIter *)&ccm);
        bchi.arr[2] = local_338.arr[2];
        bchi.arr[0] = local_338.arr[0];
        bchi.arr[1] = local_338.arr[1];
        bclo.arr[2] = local_38c;
        bclo.arr[0] = (undefined4)local_210;
        bclo.arr[1] = local_210._4_4_;
        mlndlap_fillbc_cc<int>
                  ((Box *)&local_3d8,(Array4<int> *)&mfi,(Box *)(lVar14 + 0xac),bclo,bchi);
        MFIter::operator++((MFIter *)&ccm);
      }
      MFIter::~MFIter((MFIter *)&ccm);
      MFIter::MFIter((MFIter *)&ccm,
                     (FabArrayBase *)
                     this_00.
                     super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                     .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,true);
      this = local_398;
      while (ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
             m_loshft.vect[0] <
             ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
             m_loshft.vect[2]) {
        MFIter::tilebox((Box *)&local_250,(MFIter *)&ccm);
        FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                  ((Array4<int> *)&mfi,
                   (FabArray<amrex::IArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,(MFIter *)&ccm);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&local_3d8,
                   (FabArray<amrex::IArrayBox> *)
                   cmf.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,(MFIter *)&ccm);
        local_380 = (undefined **)CONCAT44(local_380._4_4_,(int)local_250.p);
        local_348 = (ulong)local_250.jstride._4_4_;
        local_340 = CONCAT44(local_340._4_4_,(int)local_250.kstride);
        for (iVar29 = (int)local_250.jstride; iVar29 <= local_250.kstride._4_4_; iVar29 = iVar29 + 1
            ) {
          for (iVar23 = local_250.p._4_4_; iVar23 <= (int)local_250.kstride; iVar23 = iVar23 + 1) {
            if ((int)local_250.p <= (int)local_250.jstride._4_4_) {
              local_368.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    )(_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      )mfi.m_fa._M_t.
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
              local_370 = mfi.fabArray;
              local_378._0_4_ = mfi.tile_size.vect[0];
              local_378._4_4_ = mfi.tile_size.vect[1];
              iVar9 = (int)local_250.p;
              do {
                iVar25 = iVar9 - local_3d8.begin.x;
                lVar14 = (long)(~local_3d8.begin.y + iVar23) *
                         CONCAT44(local_3d8.jstride._4_4_,(int)local_3d8.jstride);
                lVar28 = (~local_3d8.begin.z + iVar29) * local_3d8.kstride;
                lVar15 = (long)(iVar25 + -1) * 4 + lVar14 * 4;
                lVar14 = (long)iVar25 * 4 + lVar14 * 4;
                lVar20 = (long)(iVar23 - local_3d8.begin.y) *
                         CONCAT44(local_3d8.jstride._4_4_,(int)local_3d8.jstride);
                lVar18 = (long)(iVar25 + -1) * 4 + lVar20 * 4;
                lVar20 = (long)iVar25 * 4 + lVar20 * 4;
                lVar26 = (iVar29 - local_3d8.begin.z) * local_3d8.kstride;
                iVar33 = *(int *)((long)local_3d8.p + lVar28 * 4 + lVar14) +
                         *(int *)((long)local_3d8.p + lVar28 * 4 + lVar15) +
                         *(int *)((long)local_3d8.p + lVar28 * 4 + lVar18) +
                         *(int *)((long)local_3d8.p + lVar28 * 4 + lVar20) +
                         *(int *)((long)local_3d8.p + lVar26 * 4 + lVar15) +
                         *(int *)((long)local_3d8.p + lVar26 * 4 + lVar14) +
                         *(int *)((long)local_3d8.p + lVar26 * 4 + lVar18);
                iVar25 = *(int *)((long)local_3d8.p + lVar26 * 4 + lVar20);
                iVar31 = (iVar25 + iVar33 == 8) + 1;
                if (iVar33 + iVar25 == 0) {
                  iVar31 = 0;
                }
                *(int *)((long)mfi.m_fa._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                         ((long)iVar23 - (long)mfi.beginIndex) * (long)mfi.fabArray * 4 +
                         (long)(iVar9 - mfi.currentIndex) * 4 +
                        ((long)iVar29 - (long)mfi.endIndex) * mfi.tile_size.vect._0_8_ * 4) = iVar31
                ;
                iVar9 = iVar9 + 1;
              } while (local_250.jstride._4_4_ + 1 != iVar9);
            }
          }
          this = local_398;
        }
        MFIter::operator++((MFIter *)&ccm);
      }
      MFIter::~MFIter((MFIter *)&ccm);
      lVar15 = local_388;
      uVar13 = (ulong)(uint)(this->super_MLLinOp).m_num_amr_levels;
    }
    _Var4.
    super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>.
    _M_t.
    super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>.
    super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
         (this->m_has_fine_bndry).
         super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_t.
         super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
    ;
    MFIter::MFIter((MFIter *)&ccm,
                   (FabArrayBase *)
                   _Var4.
                   super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                   .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl,'\0');
    while (ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
           m_loshft.vect[0] <
           ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
           m_loshft.vect[2]) {
      uVar10 = ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
               m_bndryReg.m_loshft.vect[0];
      if (ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._52_8_ != 0) {
        uVar10 = *(int *)(*(long *)ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.
                                   m_bat.m_op._52_8_ +
                         (long)ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.
                               m_bat.m_op.m_bndryReg.m_loshft.vect[0] * 4);
      }
      *(undefined4 *)
       ((long)((FabArrayBase *)
              ((long)_Var4.
                     super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                     .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl + 0xf0))->
              _vptr_FabArrayBase + (long)(int)uVar10 * 4) = 0;
      MFIter::operator++((MFIter *)&ccm);
    }
    MFIter::~MFIter((MFIter *)&ccm);
    iVar29 = *(this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    lVar15 = *(long *)&(((this->super_MLLinOp).m_geom.
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    piVar5 = (this->m_owner_mask_bottom)._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
             super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
    ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x1;
    ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
    ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
    ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
    ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )&PTR__FabFactory_007d2928;
    MultiFab::define(&this->m_bottom_dot_mask,
                     (BoxArray *)
                     ((long)&(piVar5->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8),
                     (DistributionMapping *)
                     ((long)&(piVar5->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 0x70),1
                     ,0,(MFInfo *)&ccm,(FabFactory<amrex::FArrayBox> *)&mfi);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                  m_bndryReg.m_typ);
    anon_unknown_1::MLNodeLinOp_set_dot_mask
              (&this->m_bottom_dot_mask,piVar5,(Geometry *)((long)iVar29 * 200 + lVar15 + -200),
               &local_2d8,&local_338,this->m_coarsening_strategy);
    if (this->m_is_bottom_singular == true) {
      piVar5 = (this->m_owner_mask_top)._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
               super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
      geom = *(Geometry **)
              &(((this->super_MLLinOp).m_geom.
                 super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x1
      ;
      ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
      ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
      ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
      ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )&PTR__FabFactory_007d2928;
      MultiFab::define(&this->m_coarse_dot_mask,
                       (BoxArray *)
                       ((long)&(piVar5->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8),
                       (DistributionMapping *)
                       ((long)&(piVar5->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 0x70)
                       ,1,0,(MFInfo *)&ccm,(FabFactory<amrex::FArrayBox> *)&mfi);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ccm.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                    m_bndryReg.m_typ);
      anon_unknown_1::MLNodeLinOp_set_dot_mask
                (&this->m_coarse_dot_mask,piVar5,geom,&local_2d8,&local_338,
                 this->m_coarsening_strategy);
    }
  }
  return;
}

Assistant:

void
MLNodeLinOp::buildMasks ()
{
    if (m_masks_built) return;

    BL_PROFILE("MLNodeLinOp::buildMasks()");

    m_masks_built = true;

    m_is_bottom_singular = false;
    auto itlo = std::find(m_lobc[0].begin(), m_lobc[0].end(), BCType::Dirichlet);
    auto ithi = std::find(m_hibc[0].begin(), m_hibc[0].end(), BCType::Dirichlet);
    if (itlo == m_lobc[0].end() && ithi == m_hibc[0].end())
    {  // No Dirichlet
        m_is_bottom_singular = (m_domain_covered[0] && !m_overset_dirichlet_mask);
    }

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const Geometry& geom = m_geom[amrlev][mglev];
            const auto& period = geom.periodicity();
            const Box& ccdomain = geom.Domain();
            const Box& nddomain = amrex::surroundingNodes(ccdomain);

            auto& dmask = *m_dirichlet_mask[amrlev][mglev];

            iMultiFab ccm(m_grids[amrlev][mglev],m_dmap[amrlev][mglev],1,1);
            ccm.BuildMask(ccdomain,period,0,1,2,0);

            MFItInfo mfi_info;
            if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

            if (m_overset_dirichlet_mask && mglev > 0) {
                const auto& dmask_fine = *m_dirichlet_mask[amrlev][mglev-1];
                amrex::average_down_nodal(dmask_fine, dmask, IntVect(2));
            }
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(dmask, mfi_info); mfi.isValid(); ++mfi)
            {
                const Box& ndbx = mfi.validbox();
                Array4<int> const& mskarr = dmask.array(mfi);
                Array4<int const> const& ccarr = ccm.const_array(mfi);
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( ndbx, tbx,
                {
                    mlndlap_set_dirichlet_mask(tbx, mskarr, ccarr, nddomain, lobc, hibc);
                });
            }
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels-1; ++amrlev)
    {
        iMultiFab& cc_mask = *m_cc_fine_mask[amrlev];
        iMultiFab& nd_mask = *m_nd_fine_mask[amrlev];
        LayoutData<int>& has_cf = *m_has_fine_bndry[amrlev];
        const Box& ccdom = m_geom[amrlev][0].Domain();

        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(AMRRefRatio(amrlev) == 2 || AMRRefRatio(amrlev) == 4,
                                         "ref_ratio != 2 and 4 not supported");

        cc_mask = amrex::makeFineMask(cc_mask, *m_cc_fine_mask[amrlev+1], cc_mask.nGrowVect(),
                                      IntVect(AMRRefRatio(amrlev)), m_geom[amrlev][0].periodicity(),
                                      0, 1, has_cf); // coarse: 0, fine: 1

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(cc_mask); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.validbox();
            Array4<int> const& fab = cc_mask.array(mfi);
            mlndlap_fillbc_cc<int>(bx,fab,ccdom,lobc,hibc);
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(nd_mask,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<int> const& nmsk = nd_mask.array(mfi);
            Array4<int const> const& cmsk = cc_mask.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_set_nodal_mask(i,j,k,nmsk,cmsk);
            });
        }
    }

    auto& has_cf = *m_has_fine_bndry[m_num_amr_levels-1];
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter mfi(has_cf); mfi.isValid(); ++mfi)
    {
        has_cf[mfi] = 0;
    }

    {
        int amrlev = 0;
        int mglev = m_num_mg_levels[amrlev]-1;
        const Geometry& geom = m_geom[amrlev][mglev];
        const iMultiFab& omask = *m_owner_mask_bottom;
        m_bottom_dot_mask.define(omask.boxArray(), omask.DistributionMap(), 1, 0);
        MLNodeLinOp_set_dot_mask(m_bottom_dot_mask, omask, geom, lobc, hibc, m_coarsening_strategy);
    }

    if (m_is_bottom_singular)
    {
        int amrlev = 0;
        int mglev = 0;
        const Geometry& geom = m_geom[amrlev][mglev];
        const iMultiFab& omask = *m_owner_mask_top;
        m_coarse_dot_mask.define(omask.boxArray(), omask.DistributionMap(), 1, 0);
        MLNodeLinOp_set_dot_mask(m_coarse_dot_mask, omask, geom, lobc, hibc, m_coarsening_strategy);
    }
}